

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinNFA.cpp
# Opt level: O2

list<int,_std::allocator<int>_> * __thiscall
la::LevenshteinNFA::Move
          (list<int,_std::allocator<int>_> *__return_storage_ptr__,LevenshteinNFA *this,
          list<int,_std::allocator<int>_> *states,char inp)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  list<int,_std::allocator<int>_> *this_00;
  byte *pbVar4;
  const_reference pvVar5;
  ulong uVar6;
  queue<int,_std::deque<int,_std::allocator<int>_>_> tmp;
  int local_9c;
  list<int,_std::allocator<int>_> *local_98;
  vector<char,_std::allocator<char>_> *local_90;
  _List_node_base *local_88;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size = 0;
  local_98 = __return_storage_ptr__;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  local_90 = &this->_transTable;
  bVar3 = 0;
  local_88 = (_List_node_base *)states;
  while (states = (list<int,_std::allocator<int>_> *)
                  (((_List_base<int,_std::allocator<int>_> *)&((_List_node_base *)states)->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        (_List_node_base *)states != local_88) {
    for (uVar6 = 0; uVar6 < this->_size; uVar6 = uVar6 + 1) {
      pbVar4 = (byte *)std::vector<char,_std::allocator<char>_>::at
                                 (local_90,this->_size *
                                           (long)*(int *)&((_List_node_base *)((long)states + 0x10))
                                                          ->_M_next + uVar6);
      bVar1 = *pbVar4;
      if (bVar1 == inp || (bVar1 & 0xfd) == 0x7c) {
        local_9c = (int)uVar6;
        std::__cxx11::list<int,_std::allocator<int>_>::push_back(local_98,&local_9c);
        if ((inp & 0xfdU) != 0x7c) {
          bVar3 = bVar1 == inp | bVar3;
        }
      }
    }
  }
  while (this_00 = local_98,
        local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar2 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
    local_9c = 0;
    while( true ) {
      if (this->_size <= (ulong)(long)local_9c) break;
      pvVar5 = std::vector<char,_std::allocator<char>_>::at
                         (local_90,this->_size * (long)iVar2 + (long)local_9c);
      if (*pvVar5 == '|') {
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_80,&local_9c);
        std::__cxx11::list<int,_std::allocator<int>_>::push_back(local_98,&local_9c);
      }
      local_9c = local_9c + 1;
    }
  }
  if (!(bool)((inp & 0xfdU) == 0x7c | bVar3)) {
    std::__cxx11::list<int,_std::allocator<int>_>::clear(local_98);
  }
  std::__cxx11::list<int,_std::allocator<int>_>::sort(this_00);
  std::__cxx11::list<int,_std::allocator<int>_>::unique(this_00);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
  return this_00;
}

Assistant:

std::list<int> LevenshteinNFA::Move(const std::list<int> &states, char inp) const
    {
        std::list<int> result;
        std::queue<int> tmp;
        bool needNormalLetter = false;
        bool findNormalLetter = false;
        if (inp != (char)LevenshteinNFA::Constants::Insertion &&
            inp != (char)LevenshteinNFA::Constants::Deletion)
            needNormalLetter = true;
        for (auto it = std::begin(states); it != std::end(states); ++it)
        {
            for (decltype(_size) j = 0; j < _size; j++)
            {
                char c = _transTable.at((*it * _size) + j);
                if (c == inp || c == (char)LevenshteinNFA::Constants::Insertion || c == (char)LevenshteinNFA::Constants::Deletion)
                {
                    if (needNormalLetter && c == inp)
                        findNormalLetter = true;
                    result.push_back(j);
                }
            }
        }
        while (!tmp.empty())
        {
            int now = tmp.front();
            tmp.pop();
            for (int j = 0; j < _size; j++)
            {
                char c = _transTable.at((now * _size) + j);
                if (c == (char)LevenshteinNFA::Constants::Deletion)
                {
                    tmp.push(j);
                    result.push_back(j);
                }
            }
        }
        if (needNormalLetter && !findNormalLetter)
            result.clear();
        result.sort();
        result.unique();
        return result;
    }